

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

mcmcx1def *
mcmini(ulong max,uint pages,ulong swapsize,osfildef *swapfp,char *swapfilename,errcxdef *errctx)

{
  mcmcx1def *__s;
  mcmhdef *pmVar1;
  mcmodef *pmVar2;
  int e;
  mcmcx1def *gmemctx;
  ulong uVar3;
  ulong __n;
  uchar *chunk;
  errdef fr_;
  
  gmemctx = (mcmcx1def *)mchalo(errctx,0x8000,"mcmini");
  e = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  fr_.errcode = e;
  if (e == 0) {
    uVar3 = 0x8000;
    if (0x8000 < max) {
      uVar3 = max;
    }
    fr_.errprv = errctx->errcxptr;
    errctx->errcxptr = &fr_;
    mcsini(&gmemctx->mcmcxswc,gmemctx,swapsize,swapfp,swapfilename,errctx);
    errctx->errcxptr = fr_.errprv;
    __s = gmemctx + 1;
    gmemctx->mcmcxtab = (mcmodef **)__s;
    __n = (ulong)(pages * 8 & 0xffff);
    memset(__s,0,__n);
    pmVar1 = (mcmhdef *)((long)&__s->mcmcxtab + __n);
    gmemctx->mcmcxhpch = pmVar1;
    pmVar1->mcmhnxt = (mcmhdef *)0x0;
    *(undefined2 *)&pmVar1[1].mcmhnxt = 0;
    *gmemctx->mcmcxtab = (mcmodef *)(pmVar1 + 2);
    memset(*gmemctx->mcmcxtab,0,0x2000);
    pmVar2 = *gmemctx->mcmcxtab;
    pmVar2->mcmoflg = 0x6a;
    pmVar2->mcmoptr = (uchar *)*gmemctx->mcmcxtab;
    pmVar2->mcmosiz = 0x2000;
    gmemctx->mcmcxmru = 0xffff;
    gmemctx->mcmcxfre = 1;
    gmemctx->mcmcxlru = 0xffff;
    gmemctx->mcmcxmax = uVar3 - 0x8000;
    gmemctx->mcmcxpage = 1;
    gmemctx->mcmcxpgmx = (ushort)pages;
    gmemctx->mcmcxerr = errctx;
    gmemctx->mcmcxcsw = mcmcswf;
    pmVar2 = *gmemctx->mcmcxtab;
    pmVar2[1].mcmonxt = 0xffff;
    pmVar2[1].mcmoprv = 0xffff;
    pmVar2[1].mcmoflg = 0x80;
    *(mcmon *)&pmVar1[0x402].mcmhnxt = gmemctx->mcmcxfre;
    pmVar2[1].mcmoptr = (uchar *)(pmVar1 + 0x403);
    pmVar2[1].mcmosiz = (ushort)pages * -8 + 0x5f60;
    *(undefined2 *)((long)&pmVar1[0x402].mcmhnxt + (ulong)(pages * -8 + 0x5f68 & 0xffff)) = 0xffff;
    mcmadpg(gmemctx,0,2);
    return gmemctx;
  }
  errctx->errcxptr = fr_.errprv;
  mcsclose(&gmemctx->mcmcxswc);
  free(gmemctx);
  errsigf(errctx,"TADS",e);
}

Assistant:

mcmcx1def *mcmini(ulong max, uint pages, ulong swapsize,
                  osfildef *swapfp, char *swapfilename, errcxdef *errctx)
{
    mcmcx1def *ctx;                /* newly-allocated cache manager context */
    uchar     *noreg chunk;/* 1st chunk of memory managed by this cache mgr */
    mcmodef   *obj;                      /* pointer to a cache object entry */
    ushort     siz;                /* size of current thing being allocated */
    ushort     rem;                             /* bytes remaining in chunk */
    int        err;
    
    NOREG((&chunk))
    
    /* make sure 'max' is big enough - must be at least one chunk */
    if (max < (ulong)MCMCHUNK) max = (ulong)MCMCHUNK;
    
    /* allocate space for control structures from low-level heap */
    rem = MCMCHUNK;
    
    IF_DEBUG(rem += sizeof(long));
    chunk = mchalo(errctx, rem, "mcmini");
    IF_DEBUG((*(ulong *)chunk = 0x01010101, chunk += sizeof(ulong),
        rem -= sizeof(ulong)));
    
    ctx = (mcmcx1def *)chunk;              /* put context at start of chunk */
    
    /* initialize swapper; clean up if it fails */
    ERRBEGIN(errctx)
        mcsini(&ctx->mcmcxswc, ctx, swapsize, swapfp, swapfilename, errctx);
    ERRCATCH(errctx, err)
        mcsclose(&ctx->mcmcxswc);
        mchfre(chunk);
        errsig(errctx, err);
    ERREND(errctx)
    
    chunk += sizeof(mcmcx1def);           /* rest of chunk is after context */
    rem -= sizeof(mcmcx1def);         /* remove from remaining size counter */

    /* allocate the page table (an array of pointers to pages) */
    ctx->mcmcxtab = (mcmodef **)chunk;            /* put at bottom of chunk */
    siz = pages * sizeof(mcmodef *);              /* calcuate size of table */

    memset(ctx->mcmcxtab, 0, (size_t)siz);            /* clear entire table */
    chunk += siz;                                  /* reflect size of table */
    rem -= siz;                       /* take it out of the remaining count */

    /* here we begin normal heap marking with object references */
    ctx->mcmcxhpch = (mcmhdef *)chunk;           /* set start of heap chain */
    chunk += sizeof(mcmhdef);
    rem -= sizeof(mcmhdef);
    ctx->mcmcxhpch->mcmhnxt = (mcmhdef *)0;    /* no next heap in chain yet */
    
    /* allocate the first page */
    *(mcmon *)chunk = 0;               /* set object number header in chunk */
    chunk += osrndsz(sizeof(mcmon));
    rem -= osrndsz(sizeof(mcmon));

    ctx->mcmcxtab[0] = (mcmodef *)chunk;          /* put at bottom of chunk */
    memset(ctx->mcmcxtab[0], 0, (size_t)MCMPAGESIZE);
    chunk += MCMPAGESIZE;                           /* reflect size of page */
    rem -= MCMPAGESIZE;                     /* take it out of the remainder */
    
    /* set up the first page with an entry for itself */
    obj = mcmgobje(ctx, (mcmon)0);             /* point to first page entry */
    obj->mcmoflg = MCMOFPRES | MCMOFNODISC | MCMOFPAGE | MCMOFNOSWAP;
    obj->mcmoptr = (uchar *)ctx->mcmcxtab[0];
    obj->mcmosiz = MCMPAGESIZE;
    
    /* set up the rest of the context */
    ctx->mcmcxlru = ctx->mcmcxmru = MCMONINV;        /* no mru/lru list yet */
    ctx->mcmcxmax = max - (ulong)MCMCHUNK;
    ctx->mcmcxpage = 1;        /* next page slot to be allocated will be #1 */
    ctx->mcmcxpgmx = pages;          /* max number of pages we can allocate */
    ctx->mcmcxerr = errctx;
    ctx->mcmcxcsw = mcmcswf;
    
    /* set up the free list with the remainder of the chunk */
    ctx->mcmcxfre = 1;     /* we've allocated object 0; obj 1 is free space */
    obj = mcmgobje(ctx, ctx->mcmcxfre);       /* point to free object entry */
    obj->mcmonxt = obj->mcmoprv = MCMONINV;             /* end of free list */
    obj->mcmoflg = MCMOFFREE;                /* mark the free block as such */
    *(mcmon *)chunk = ctx->mcmcxfre;                /* set free list header */

    chunk += osrndsz(sizeof(mcmon));
    rem -= osrndsz(sizeof(mcmon));
    obj->mcmoptr = chunk;                                  /* rest of chunk */

    obj->mcmosiz = rem - osrndsz(sizeof(mcmon));          /* remaining size in chunk */

    /* set flag for end of chunk (invalid object header) */
    *((mcmon *)(chunk + rem - osrndsz(sizeof(mcmon)))) = MCMONINV;
    
    /* set up the unused entry list with the remaining headers in the page */
    mcmadpg(ctx, 0, 2);
    
    return(ctx);
}